

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softfloat.c
# Opt level: O1

float128 float128_rem_x86_64(float128 a,float128 b,float_status *status)

{
  ulong uVar1;
  byte bVar2;
  char cVar3;
  int iVar4;
  long lVar5;
  long lVar6;
  int iVar7;
  uint32_t bLow;
  ulong uVar8;
  uint64_t aSig1;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  bool bVar12;
  bool bVar13;
  uint64_t bSig1;
  uint64_t bSig0;
  uint32_t aLow;
  int32_t bExp;
  int32_t aExp;
  uint64_t local_b8;
  ulong local_b0;
  ulong local_a8;
  uint64_t local_a0;
  ulong local_98;
  ulong local_90;
  uint local_88;
  uint local_84;
  ulong local_80;
  uint local_74;
  ulong local_70;
  ulong local_68;
  ulong local_60;
  ulong local_58;
  float_status *local_50;
  ulong local_48;
  ulong local_40;
  ulong local_38;
  
  local_a0 = b.low;
  aSig1 = a.low;
  uVar10 = a.high & 0xffffffffffff;
  local_84 = a.high._6_2_ & 0x7fff;
  local_98 = b.high & 0xffffffffffff;
  local_88 = b.high._6_2_ & 0x7fff;
  local_b0 = uVar10;
  local_b8 = aSig1;
  if (local_84 == 0x7fff) {
    if ((((undefined1  [16])a & (undefined1  [16])0xffffffffffff) == (undefined1  [16])0x0 &&
         aSig1 == 0) &&
       (((undefined1  [16])b & (undefined1  [16])0xffffffffffff) == (undefined1  [16])0x0 &&
        local_a0 == 0 || local_88 != 0x7fff)) {
LAB_004ece89:
      status->float_exception_flags = status->float_exception_flags | 1;
      return (float128)(ZEXT816(0xffff800000000000) << 0x40);
    }
LAB_004ecb3e:
    a = propagateFloat128NaN(a,b,status);
  }
  else {
    if (((undefined1  [16])b & (undefined1  [16])0x7fff000000000000) == (undefined1  [16])0x0) {
      if (((undefined1  [16])b & (undefined1  [16])0xffffffffffff) == (undefined1  [16])0x0 &&
          local_a0 == 0) goto LAB_004ece89;
      normalizeFloat128Subnormal(local_98,local_a0,(int32_t *)&local_88,&local_98,&local_a0);
    }
    else if (local_88 == 0x7fff) {
      if (((undefined1  [16])b & (undefined1  [16])0xffffffffffff) == (undefined1  [16])0x0 &&
          local_a0 == 0) {
        return a;
      }
      goto LAB_004ecb3e;
    }
    if (((undefined1  [16])a & (undefined1  [16])0x7fff000000000000) == (undefined1  [16])0x0) {
      if (((undefined1  [16])a & (undefined1  [16])0xffffffffffff) == (undefined1  [16])0x0 &&
          aSig1 == 0) {
        return a;
      }
      normalizeFloat128Subnormal(uVar10,aSig1,(int32_t *)&local_84,&local_b0,&local_b8);
    }
    iVar4 = local_84 - local_88;
    if (-2 < iVar4) {
      local_74 = local_88;
      bVar2 = iVar4 == -1 ^ 0xf;
      uVar10 = local_b8 << bVar2;
      local_b0 = local_b8 >> ((iVar4 == -1) + 0x31U & 0x3f) | (local_b0 | 0x1000000000000) << bVar2;
      local_90 = local_a0 * 0x8000;
      local_98 = local_98 << 0xf;
      local_80 = local_98 | 0x8000000000000000;
      local_70 = local_a0 >> 0x31;
      local_a8 = local_70 + local_80;
      bVar12 = local_a8 <= local_b0;
      bVar13 = local_b0 == local_a8;
      local_b8 = uVar10;
      if (local_90 <= uVar10 && bVar13 || bVar12 && !bVar13) {
        local_b8 = uVar10 + local_a0 * -0x8000;
        local_b0 = (local_b0 - local_a8) - (ulong)(uVar10 < local_90);
      }
      iVar7 = iVar4 + -0x40;
      if (iVar4 < 0x41) {
        uVar10 = (ulong)(local_90 <= uVar10 && bVar13 || bVar12 && !bVar13);
      }
      else {
        uVar9 = local_80 >> 0x20;
        local_60 = local_98 & 0xffffffff00000000 | 0x8000000000000000;
        local_58 = local_a8 & 0xffffffff;
        local_40 = local_90 >> 0x20;
        local_48 = local_90 & 0xffffffff;
        iVar4 = iVar7;
        do {
          local_38 = local_b8;
          uVar8 = 0xffffffffffffffff;
          if (local_b0 < local_a8) {
            uVar10 = 0xffffffff00000000;
            if (local_b0 < local_60) {
              uVar10 = local_b0 / uVar9 << 0x20;
            }
            uVar1 = (uVar10 >> 0x20) * local_58;
            uVar11 = uVar10 * local_a8;
            uVar8 = local_38 - uVar11;
            lVar5 = ((local_b0 - ((uVar1 >> 0x20) + uVar9 * (uVar10 >> 0x20))) -
                    (ulong)(local_38 < uVar11)) - (ulong)(uVar11 < uVar1 << 0x20);
            if (lVar5 < 0) {
              uVar1 = (0x100000000 - uVar10) * local_a8 + local_38;
              uVar11 = uVar8;
              do {
                uVar10 = uVar10 - 0x100000000;
                uVar8 = uVar11 + (local_a8 << 0x20);
                bVar12 = uVar1 < uVar11;
                uVar1 = uVar1 + (local_a8 << 0x20);
                lVar5 = lVar5 + uVar9 + (ulong)bVar12;
                uVar11 = uVar8;
              } while (lVar5 < 0);
            }
            uVar8 = uVar8 >> 0x20 | lVar5 << 0x20;
            if (uVar8 < local_60) {
              uVar8 = uVar8 / uVar9;
            }
            else {
              uVar8 = 0xffffffff;
            }
            uVar8 = uVar8 | uVar10;
          }
          uVar10 = uVar8 - 4;
          if (uVar8 < 4) {
            uVar10 = 0;
          }
          uVar8 = uVar10 >> 0x20;
          uVar1 = (uVar10 & 0xffffffff) * local_40;
          uVar11 = uVar1 + uVar8 * local_48;
          lVar5 = 0;
          if (CARRY8(uVar1,uVar8 * local_48)) {
            lVar5 = 0x100000000;
          }
          lVar6 = (uVar10 & 0xffffffff) * uVar9 + uVar8 * local_58;
          uVar1 = uVar10 * local_a8;
          uVar8 = uVar8 * local_40 + uVar1 + (uVar11 >> 0x20) + lVar5 +
                  (ulong)(uVar10 * local_90 < uVar11 << 0x20);
          uVar11 = uVar8 << 0x3d | uVar10 * local_90 >> 3;
          local_b8 = -uVar11;
          local_b0 = ((local_b0 << 0x3d | local_38 >> 3) - (ulong)(uVar11 != 0)) -
                     ((ulong)((uint)(uVar8 < uVar1) +
                             (uint)(uVar1 < (ulong)(lVar6 << 0x20)) +
                             (int)((ulong)lVar6 >> 0x20) +
                             (int)(local_80 >> 0x20) * (int)(uVar10 >> 0x20)) << 0x3d | uVar8 >> 3);
          iVar7 = iVar4 + -0x3d;
          bVar12 = 0x3d < iVar4;
          iVar4 = iVar7;
        } while (bVar12);
      }
      if (iVar7 < -0x3f) {
        local_b8 = local_b8 >> 0xc | local_b0 << 0x34;
        local_b0 = local_b0 >> 0xc;
        local_a0 = local_70 << 0x34 | local_90 >> 0xc;
      }
      else {
        uVar9 = 0xffffffffffffffff;
        if (local_b0 < local_a8) {
          uVar8 = local_80 >> 0x20;
          local_80 = local_98 & 0xffffffff00000000 | 0x8000000000000000;
          uVar10 = 0xffffffff00000000;
          if (local_b0 < local_80) {
            uVar10 = local_b0 / uVar8 << 0x20;
          }
          uVar11 = (local_a8 & 0xffffffff) * (uVar10 >> 0x20);
          uVar1 = uVar10 * local_a8;
          uVar9 = local_b8 - uVar1;
          lVar5 = ((local_b0 - ((uVar11 >> 0x20) + (uVar10 >> 0x20) * uVar8)) -
                  (ulong)(local_b8 < uVar1)) - (ulong)(uVar1 < uVar11 << 0x20);
          if (lVar5 < 0) {
            uVar1 = (0x100000000 - uVar10) * local_a8 + local_b8;
            uVar11 = uVar9;
            do {
              uVar10 = uVar10 - 0x100000000;
              uVar9 = uVar11 + (local_a8 << 0x20);
              bVar12 = uVar1 < uVar11;
              uVar1 = uVar1 + (local_a8 << 0x20);
              lVar5 = lVar5 + uVar8 + (ulong)bVar12;
              uVar11 = uVar9;
            } while (lVar5 < 0);
          }
          uVar9 = uVar9 >> 0x20 | lVar5 << 0x20;
          if (uVar9 < local_80) {
            uVar9 = uVar9 / uVar8;
          }
          else {
            uVar9 = 0xffffffff;
          }
          uVar9 = uVar9 | uVar10;
        }
        uVar10 = 0;
        if (3 < uVar9) {
          uVar10 = uVar9 - 4;
        }
        cVar3 = (char)iVar7;
        uVar10 = uVar10 >> (-cVar3 & 0x3fU);
        local_a0 = local_70 << 0x34 | local_90 >> 0xc;
        bVar2 = (byte)(iVar7 + 0x34);
        if (iVar7 < -0x34) {
          uVar9 = local_b0 << (bVar2 & 0x3f);
          local_b0 = local_b0 >> (-cVar3 - 0x34U & 0x3f);
          uVar9 = local_b8 >> (-cVar3 - 0x34U & 0x3f) | uVar9;
        }
        else {
          uVar9 = local_b8 << (bVar2 & 0x3f);
          if (iVar7 + 0x34 != 0) {
            local_b0 = local_b0 << (bVar2 & 0x3f) | local_b8 >> (0xcU - cVar3 & 0x3f);
          }
        }
        local_b8 = uVar9;
        uVar9 = (local_90 >> 0xc & 0xffffffff) * (uVar10 >> 0x20);
        uVar8 = (uVar10 & 0xffffffff) * (local_a0 >> 0x20);
        lVar5 = 0;
        uVar1 = uVar8 + uVar9;
        if (CARRY8(uVar8,uVar9)) {
          lVar5 = -0x100000000;
        }
        uVar9 = local_a0 * uVar10;
        bVar12 = local_b8 < uVar9;
        local_b8 = local_b8 - uVar9;
        local_b0 = (((lVar5 - ((uVar10 >> 0x20) * (local_a0 >> 0x20) + (local_a8 >> 0xc) * uVar10 +
                              (uVar1 >> 0x20))) - (ulong)(uVar9 < uVar1 << 0x20)) + local_b0) -
                   (ulong)bVar12;
      }
      local_98 = local_a8 >> 0xc;
      uVar9 = local_a0 + local_b8 * 2;
      uVar10 = uVar10 - 1;
      do {
        uVar8 = local_b0;
        uVar9 = uVar9 + local_a0 * -2;
        uVar10 = uVar10 + 1;
        bVar12 = local_b8 < local_a0;
        local_b8 = local_b8 - local_a0;
        local_b0 = (uVar8 - local_98) - (ulong)bVar12;
      } while (-1 < (long)local_b0);
      lVar5 = local_b0 + uVar8 + (ulong)(uVar9 < local_b8);
      if ((lVar5 < 0) || ((uVar10 & 1) == 0 && (lVar5 == 0 && uVar9 == 0))) {
        local_b8 = local_a0 + local_b8;
        local_b0 = uVar8;
      }
      uVar10 = local_b0;
      if ((long)local_b0 < 0) {
        bVar12 = local_b8 != 0;
        local_b8 = -local_b8;
        local_b0 = -local_b0 - (ulong)bVar12;
      }
      local_68 = a.high;
      local_50 = status;
      a = normalizeRoundAndPackFloat128
                    ((byte)((byte)(uVar10 >> 0x38) ^ a.high._7_1_) >> 7,local_88 - 4,local_b0,
                     local_b8,status);
    }
  }
  return a;
}

Assistant:

float128 float128_rem(float128 a, float128 b, float_status *status)
{
    flag aSign, zSign;
    int32_t aExp, bExp, expDiff;
    uint64_t aSig0, aSig1, bSig0, bSig1, q, term0, term1, term2;
    uint64_t allZero, alternateASig0, alternateASig1, sigMean1;
    int64_t sigMean0;

    aSig1 = extractFloat128Frac1( a );
    aSig0 = extractFloat128Frac0( a );
    aExp = extractFloat128Exp( a );
    aSign = extractFloat128Sign( a );
    bSig1 = extractFloat128Frac1( b );
    bSig0 = extractFloat128Frac0( b );
    bExp = extractFloat128Exp( b );
    if ( aExp == 0x7FFF ) {
        if (    ( aSig0 | aSig1 )
             || ( ( bExp == 0x7FFF ) && ( bSig0 | bSig1 ) ) ) {
            return propagateFloat128NaN(a, b, status);
        }
        goto invalid;
    }
    if ( bExp == 0x7FFF ) {
        if (bSig0 | bSig1) {
            return propagateFloat128NaN(a, b, status);
        }
        return a;
    }
    if ( bExp == 0 ) {
        if ( ( bSig0 | bSig1 ) == 0 ) {
 invalid:
            float_raise(float_flag_invalid, status);
            return float128_default_nan(status);
        }
        normalizeFloat128Subnormal( bSig0, bSig1, &bExp, &bSig0, &bSig1 );
    }
    if ( aExp == 0 ) {
        if ( ( aSig0 | aSig1 ) == 0 ) return a;
        normalizeFloat128Subnormal( aSig0, aSig1, &aExp, &aSig0, &aSig1 );
    }
    expDiff = aExp - bExp;
    if ( expDiff < -1 ) return a;
    shortShift128Left(
        aSig0 | UINT64_C(0x0001000000000000),
        aSig1,
        15 - ( expDiff < 0 ),
        &aSig0,
        &aSig1
    );
    shortShift128Left(
        bSig0 | UINT64_C(0x0001000000000000), bSig1, 15, &bSig0, &bSig1 );
    q = le128( bSig0, bSig1, aSig0, aSig1 );
    if ( q ) sub128( aSig0, aSig1, bSig0, bSig1, &aSig0, &aSig1 );
    expDiff -= 64;
    while ( 0 < expDiff ) {
        q = estimateDiv128To64( aSig0, aSig1, bSig0 );
        q = ( 4 < q ) ? q - 4 : 0;
        mul128By64To192( bSig0, bSig1, q, &term0, &term1, &term2 );
        shortShift192Left( term0, term1, term2, 61, &term1, &term2, &allZero );
        shortShift128Left( aSig0, aSig1, 61, &aSig0, &allZero );
        sub128( aSig0, 0, term1, term2, &aSig0, &aSig1 );
        expDiff -= 61;
    }
    if ( -64 < expDiff ) {
        q = estimateDiv128To64( aSig0, aSig1, bSig0 );
        q = ( 4 < q ) ? q - 4 : 0;
        q >>= - expDiff;
        shift128Right( bSig0, bSig1, 12, &bSig0, &bSig1 );
        expDiff += 52;
        if ( expDiff < 0 ) {
            shift128Right( aSig0, aSig1, - expDiff, &aSig0, &aSig1 );
        }
        else {
            shortShift128Left( aSig0, aSig1, expDiff, &aSig0, &aSig1 );
        }
        mul128By64To192( bSig0, bSig1, q, &term0, &term1, &term2 );
        sub128( aSig0, aSig1, term1, term2, &aSig0, &aSig1 );
    }
    else {
        shift128Right( aSig0, aSig1, 12, &aSig0, &aSig1 );
        shift128Right( bSig0, bSig1, 12, &bSig0, &bSig1 );
    }
    do {
        alternateASig0 = aSig0;
        alternateASig1 = aSig1;
        ++q;
        sub128( aSig0, aSig1, bSig0, bSig1, &aSig0, &aSig1 );
    } while ( 0 <= (int64_t) aSig0 );
    add128(
        aSig0, aSig1, alternateASig0, alternateASig1, (uint64_t *)&sigMean0, &sigMean1 );
    if (    ( sigMean0 < 0 )
         || ( ( ( sigMean0 | sigMean1 ) == 0 ) && ( q & 1 ) ) ) {
        aSig0 = alternateASig0;
        aSig1 = alternateASig1;
    }
    zSign = ( (int64_t) aSig0 < 0 );
    if ( zSign ) sub128( 0, 0, aSig0, aSig1, &aSig0, &aSig1 );
    return normalizeRoundAndPackFloat128(aSign ^ zSign, bExp - 4, aSig0, aSig1,
                                         status);
}